

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O3

void __thiscall diff_match_patch_test::testPatchObj(diff_match_patch_test *this)

{
  long lVar1;
  diff_match_patch_test *this_00;
  wstring *pwVar2;
  deque<Diff,_std::allocator<Diff>_> *pdVar3;
  byte bVar4;
  wstring local_3c8;
  wstring local_3a8;
  long *local_388 [2];
  long local_378 [2];
  long *local_368 [2];
  long local_358 [2];
  long *local_348 [2];
  long local_338 [2];
  long *local_328 [2];
  long local_318 [2];
  long *local_308 [2];
  long local_2f8 [2];
  long *local_2e8 [2];
  long local_2d8 [2];
  long *local_2c8 [2];
  long local_2b8 [2];
  long *local_2a8 [2];
  long local_298 [2];
  Diff local_288;
  Diff local_260;
  Diff local_238;
  Diff local_210;
  _Map_pointer local_1e8;
  size_type sStack_1e0;
  Diff local_1d8;
  Diff local_1b0;
  Diff local_188;
  Diff local_160;
  Diff local_138;
  Diff local_110;
  wstring strp;
  deque<Diff,_std::allocator<Diff>_> local_90;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  bVar4 = 0;
  Patch::Patch((Patch *)&local_90);
  local_40 = 0x14;
  uStack_3c = 0x15;
  uStack_38 = 0x12;
  uStack_34 = 0x11;
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_3c8,L"jump",L"");
  Diff::Diff(&local_210,Equal,(wstring *)&local_3c8);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_3a8,L"s",L"");
  Diff::Diff(&local_238,Delete,(wstring *)&local_3a8);
  local_2a8[0] = local_298;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_2a8,L"ed",L"");
  Diff::Diff(&local_260,Insert,(wstring *)local_2a8);
  local_2c8[0] = local_2b8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_2c8,L" over ",L"");
  Diff::Diff(&local_288,Equal,(wstring *)local_2c8);
  local_2e8[0] = local_2d8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_2e8,L"the",L"");
  Diff::Diff(&local_110,Delete,(wstring *)local_2e8);
  local_308[0] = local_2f8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_308,L"a",L"");
  Diff::Diff(&local_138,Insert,(wstring *)local_308);
  local_328[0] = local_318;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_328,L"\nlaz",L"");
  Diff::Diff(&local_160,Equal,(wstring *)local_328);
  local_348[0] = local_338;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_348,L"");
  Diff::Diff(&local_188,Insert,(wstring *)local_348);
  local_368[0] = local_358;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_368,L"");
  Diff::Diff(&local_1b0,Insert,(wstring *)local_368);
  local_388[0] = local_378;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_388,L"");
  this_00 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_1d8,Insert,(wstring *)local_388);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&strp,this_00,&local_210,&local_238,&local_260,
           &local_288,&local_110,&local_138,&local_160,&local_188,&local_1b0,&local_1d8);
  local_1e8 = local_90.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data
              ._M_map;
  sStack_1e0 = local_90.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.
               super__Deque_impl_data._M_map_size;
  pwVar2 = &strp;
  pdVar3 = &local_90;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pdVar3->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (((_Deque_base<Diff,_std::allocator<Diff>_> *)&pwVar2->_M_dataplus)->_M_impl).
         super__Deque_impl_data._M_map;
    pwVar2 = (wstring *)((long)pwVar2 + (ulong)bVar4 * -0x10 + 8);
    pdVar3 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  strp._M_dataplus._M_p =
       (pointer)local_90.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.
                super__Deque_impl_data._M_map;
  strp._M_string_length =
       local_90.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  strp.field_2._M_allocated_capacity =
       (size_type)
       local_90.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  strp.field_2._8_8_ =
       local_90.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  std::deque<Diff,_std::allocator<Diff>_>::clear((deque<Diff,_std::allocator<Diff>_> *)&strp);
  std::deque<Diff,_std::allocator<Diff>_>::~deque((deque<Diff,_std::allocator<Diff>_> *)&strp);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1d8.text._M_dataplus._M_p != &local_1d8.text.field_2) {
    operator_delete(local_1d8.text._M_dataplus._M_p,
                    local_1d8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_388[0] != local_378) {
    operator_delete(local_388[0],local_378[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1b0.text._M_dataplus._M_p != &local_1b0.text.field_2) {
    operator_delete(local_1b0.text._M_dataplus._M_p,
                    local_1b0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_188.text._M_dataplus._M_p != &local_188.text.field_2) {
    operator_delete(local_188.text._M_dataplus._M_p,
                    local_188.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],local_338[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_160.text._M_dataplus._M_p != &local_160.text.field_2) {
    operator_delete(local_160.text._M_dataplus._M_p,
                    local_160.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_138.text._M_dataplus._M_p != &local_138.text.field_2) {
    operator_delete(local_138.text._M_dataplus._M_p,
                    local_138.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0],local_2f8[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_110.text._M_dataplus._M_p != &local_110.text.field_2) {
    operator_delete(local_110.text._M_dataplus._M_p,
                    local_110.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0],local_2d8[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_288.text._M_dataplus._M_p != &local_288.text.field_2) {
    operator_delete(local_288.text._M_dataplus._M_p,
                    local_288.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0],local_2b8[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_260.text._M_dataplus._M_p != &local_260.text.field_2) {
    operator_delete(local_260.text._M_dataplus._M_p,
                    local_260.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_238.text._M_dataplus._M_p != &local_238.text.field_2) {
    operator_delete(local_238.text._M_dataplus._M_p,
                    local_238.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_210.text._M_dataplus._M_p != &local_210.text.field_2) {
    operator_delete(local_210.text._M_dataplus._M_p,
                    local_210.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity * 4 + 4);
  }
  strp._M_dataplus._M_p = (pointer)&strp.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&strp,L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n",
             L"");
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_3c8,L"Patch: toString.",L"")
  ;
  pwVar2 = &local_3a8;
  Patch::toString_abi_cxx11_();
  assertEquals((diff_match_patch_test *)pwVar2,&local_3c8,&strp,&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)strp._M_dataplus._M_p != &strp.field_2) {
    operator_delete(strp._M_dataplus._M_p,strp.field_2._M_allocated_capacity * 4 + 4);
  }
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_90);
  return;
}

Assistant:

void diff_match_patch_test::testPatchObj() {
  // Patch Object.
  Patch p;
  p.start1 = 20;
  p.start2 = 21;
  p.length1 = 18;
  p.length2 = 17;
  p.diffs = diffList(Diff(Diff::Operation::Equal, L"jump"), Diff(Diff::Operation::Delete, L"s"), Diff(Diff::Operation::Insert, L"ed"), Diff(Diff::Operation::Equal, L" over "), Diff(Diff::Operation::Delete, L"the"), Diff(Diff::Operation::Insert, L"a"), Diff(Diff::Operation::Equal, L"\nlaz"));
  std::wstring strp = L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n";
  assertEquals(L"Patch: toString.", strp, p.toString());
}